

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point-to-point.cpp
# Opt level: O2

request diy::mpi::detail::isend
                  (DIY_MPI_Comm comm,int dest,int tag,void *data,int count,datatype *type)

{
  request r;
  DIY_MPI_Request local_10;
  
  MPI_Isend(data,count,(type->handle).data,dest,tag,comm.data,&local_10);
  return (request)(DIY_MPI_Request)local_10.data;
}

Assistant:

request isend(DIY_MPI_Comm comm, int dest, int tag, const void* data, int count, const datatype& type)
{
#if DIY_HAS_MPI
  request r;
  MPI_Isend(data, count, mpi_cast(type.handle), dest, tag, mpi_cast(comm), &mpi_cast(r.handle));
  return r;
#else
  (void) comm; (void) dest; (void) tag; (void) data; (void) count; (void) type;
  DIY_UNSUPPORTED_MPI_CALL(MPI_Isend);
#endif
}